

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O1

void __thiscall
actorpp::detail::ChannelImpl<actorpp::CloseReason>::ChannelImpl
          (ChannelImpl<actorpp::CloseReason> *this,
          shared_ptr<actorpp::detail::ActorImpl> *actor_impl)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->actor_impl).super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (actor_impl->super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (this->actor_impl).super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (actor_impl->super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (actor_impl->super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->actor_impl).super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (actor_impl->super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->elements).c.super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>::_M_initialize_map
            ((_Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_> *)
             &this->elements,0);
  return;
}

Assistant:

ChannelImpl(std::shared_ptr<ActorImpl> actor_impl)
      : actor_impl(std::move(actor_impl)) {}